

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeFloat(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Feature *pFVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_5b0;
  DiagnosticStream local_3d8;
  DiagnosticStream local_200;
  uint local_24;
  Instruction *pIStack_20;
  uint num_bits;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
  if (local_24 == 0x20) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else if (local_24 == 0x10) {
    pFVar2 = ValidationState_t::features((ValidationState_t *)inst_local);
    if ((pFVar2->declare_float16_type & 1U) == 0) {
      ValidationState_t::diag
                (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_200,(char (*) [31])"Using a 16-bit floating point ");
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [118])
                                 "type requires the Float16 or Float16Buffer capability, or an extension that explicitly enables 16-bit floating point."
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_200);
    }
    else {
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  else if (local_24 == 0x40) {
    bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Float64);
    if (bVar1) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_3d8,(char (*) [31])"Using a 64-bit floating point ");
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [38])"type requires the Float64 capability.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3d8);
    }
  }
  else {
    ValidationState_t::diag
              (&local_5b0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
    pDVar3 = DiagnosticStream::operator<<(&local_5b0,(char (*) [25])"Invalid number of bits (");
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_24);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [24])") used for OpTypeFloat.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_5b0);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeFloat(ValidationState_t& _, const Instruction* inst) {
  // Validates that the number of bits specified for an Int type is valid.
  // Scalar integer types can be parameterized only with 32-bits.
  // Int8, Int16, and Int64 capabilities allow using 8-bit, 16-bit, and 64-bit
  // integers, respectively.
  auto num_bits = inst->GetOperandAs<const uint32_t>(1);
  if (num_bits == 32) {
    return SPV_SUCCESS;
  }
  if (num_bits == 16) {
    if (_.features().declare_float16_type) {
      return SPV_SUCCESS;
    }
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Using a 16-bit floating point "
           << "type requires the Float16 or Float16Buffer capability,"
              " or an extension that explicitly enables 16-bit floating point.";
  }
  if (num_bits == 64) {
    if (_.HasCapability(spv::Capability::Float64)) {
      return SPV_SUCCESS;
    }
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Using a 64-bit floating point "
           << "type requires the Float64 capability.";
  }
  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << "Invalid number of bits (" << num_bits << ") used for OpTypeFloat.";
}